

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_text(lyout *out,char *label,char *arg,char *text,int closeit,int *first)

{
  char *pcVar1;
  bool bVar2;
  int *first_local;
  int closeit_local;
  char *text_local;
  char *arg_local;
  char *label_local;
  lyout *out_local;
  
  if (text != (char *)0x0) {
    bVar2 = false;
    if (first != (int *)0x0) {
      bVar2 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar2) {
      pcVar1 = "";
    }
    ly_print(out,"%s\"%s\":{\"%s\":",pcVar1,label,arg);
    json_print_string(out,text);
    if (closeit != 0) {
      ly_print(out,"}");
    }
    if (first != (int *)0x0) {
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_text(struct lyout *out, const char *label, const char *arg, const char *text, int closeit, int *first)
{
    if (!text) {
        return;
    }
    ly_print(out, "%s\"%s\":{\"%s\":", (first && (*first)) ? "" : ",", label, arg);
    json_print_string(out, text);
    if (closeit) {
        ly_print(out, "}");
    }
    if (first) {
        (*first) = 0;
    }
}